

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureVectorizer.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::FeatureVectorizer_InputColumn::SharedDtor
          (FeatureVectorizer_InputColumn *this)

{
  string *psVar1;
  pointer pcVar2;
  
  psVar1 = (this->inputcolumn_).ptr_;
  if (psVar1 == (string *)0x0 ||
      psVar1 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    return;
  }
  pcVar2 = (psVar1->_M_dataplus)._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &psVar1->field_2) {
    operator_delete(pcVar2,(psVar1->field_2)._M_allocated_capacity + 1);
  }
  operator_delete(psVar1,0x20);
  return;
}

Assistant:

void FeatureVectorizer_InputColumn::CheckTypeAndMergeFrom(
    const ::google::protobuf::MessageLite& from) {
  MergeFrom(*::google::protobuf::down_cast<const FeatureVectorizer_InputColumn*>(&from));
}